

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O2

void address_space_stw_internal_cached_slow_m68k
               (uc_struct_conflict3 *uc,MemoryRegionCache *cache,hwaddr addr,uint32_t val,
               MemTxAttrs attrs,MemTxResult *result,device_endian endian)

{
  MemTxResult MVar1;
  MemoryRegion *mr;
  undefined2 *puVar2;
  ulong data;
  hwaddr addr1;
  hwaddr l;
  
  data = (ulong)val;
  l = 2;
  mr = address_space_translate_cached(cache,addr,&addr1,&l,true,attrs);
  if (((l < 2) || (mr->ram != true)) || (mr->readonly == true)) {
    MVar1 = memory_region_dispatch_write_m68k
                      (uc,mr,addr1,data,(uint)(endian != DEVICE_LITTLE_ENDIAN) * 8 + MO_16,attrs);
  }
  else {
    puVar2 = (undefined2 *)qemu_map_ram_ptr_m68k((uc_struct_conflict3 *)mr->uc,mr->ram_block,addr1);
    if ((endian == DEVICE_BIG_ENDIAN) || (endian != DEVICE_LITTLE_ENDIAN)) {
      data = (ulong)(ushort)((ushort)val << 8 | (ushort)val >> 8);
    }
    *puVar2 = (short)data;
    MVar1 = 0;
  }
  if (result != (MemTxResult *)0x0) {
    *result = MVar1;
  }
  return;
}

Assistant:

static inline void glue(address_space_stw_internal, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, uint32_t val, MemTxAttrs attrs,
    MemTxResult *result, enum device_endian endian)
{
    uint8_t *ptr;
    MemoryRegion *mr;
    hwaddr l = 2;
    hwaddr addr1;
    MemTxResult r;
    bool release_lock = false;

    //RCU_READ_LOCK();
    mr = TRANSLATE(addr, &addr1, &l, true, attrs);
    if (l < 2 || !memory_access_is_direct(mr, true)) {
        release_lock |= prepare_mmio_access(mr);
        r = memory_region_dispatch_write(uc, mr, addr1, val,
                                         MO_16 | devend_memop(endian), attrs);
    } else {
        /* RAM case */
        ptr = qemu_map_ram_ptr(mr->uc, mr->ram_block, addr1);
        switch (endian) {
        case DEVICE_LITTLE_ENDIAN:
            stw_le_p(ptr, val);
            break;
        case DEVICE_BIG_ENDIAN:
            stw_be_p(ptr, val);
            break;
        default:
            stw_p(ptr, val);
            break;
        }
        invalidate_and_set_dirty(mr, addr1, 2);
        r = MEMTX_OK;
    }
    if (result) {
        *result = r;
    }
    //RCU_READ_UNLOCK();
}